

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_re.c
# Opt level: O3

int pull_by_re(char *input_file,char *aStrRegex,int min,int max,int length,int exclude,int convert,
              int just_count)

{
  kstring_t *str;
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  gzFile pgVar6;
  kstream_t *pkVar7;
  uchar *puVar8;
  pcre2_code_8 *re;
  char *pcVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  int iVar13;
  size_t __size;
  kstring_t *str_00;
  undefined8 unaff_R12;
  kseq_t *unaff_R14;
  uint uVar14;
  int errornumber;
  size_t erroroffset;
  PCRE2_UCHAR8 buffer [256];
  uint uStackY_194;
  char *pcStackY_190;
  undefined8 uStackY_188;
  kseq_t *pkStackY_180;
  char *pcStackY_178;
  code *pcStackY_170;
  undefined1 local_14c [4];
  gzFile local_148;
  undefined1 local_140 [8];
  kstring_t local_138 [11];
  
  pcStackY_170 = (code *)0x1048a7;
  pgVar6 = (gzFile)gzopen(input_file,"r");
  if (pgVar6 == (gzFile)0x0) {
    pcStackY_170 = (code *)0x104ab9;
    pull_by_re_cold_3();
  }
  else {
    pcStackY_170 = (code *)0x1048c2;
    unaff_R14 = (kseq_t *)calloc(1,0x70);
    pcStackY_170 = (code *)0x1048d4;
    pkVar7 = (kstream_t *)calloc(1,0x20);
    pkVar7->f = pgVar6;
    pcStackY_170 = (code *)0x1048e5;
    puVar8 = (uchar *)malloc(0xffff);
    pkVar7->buf = puVar8;
    unaff_R14->f = pkVar7;
    pcStackY_170 = (code *)0x1048f4;
    kseq_read(unaff_R14);
    pcVar9 = (unaff_R14->qual).s;
    unaff_R12 = 0;
    pcStackY_170 = (code *)0x104910;
    local_148 = pgVar6;
    gzrewind(pgVar6);
    pkVar7 = unaff_R14->f;
    pkVar7->begin = 0;
    pkVar7->end = 0;
    pkVar7->is_eof = 0;
    unaff_R14->last_char = 0;
    if (verbose_flag != 0) {
      pcStackY_170 = (code *)0x104aac;
      pull_by_re_cold_1();
    }
    input_file = (char *)0x0;
    pcStackY_170 = (code *)0x104954;
    re = (pcre2_code_8 *)pcre2_compile_8(aStrRegex,0xffffffffffffffff,0,local_14c,local_140,0);
    if (re != (pcre2_code_8 *)0x0) {
      pcStackY_170 = (code *)0x104968;
      iVar4 = kseq_read(unaff_R14);
      uVar14 = 0;
      if (-1 < iVar4) {
        uVar14 = 0;
        input_file = (char *)0x0;
        do {
          pcStackY_170 = (code *)0x10498e;
          iVar4 = search_header(re,(unaff_R14->name).s);
          if (exclude == 0) {
            if (iVar4 == 0) {
              pcStackY_170 = (code *)0x1049b8;
              iVar4 = search_header(re,(unaff_R14->comment).s);
              if (iVar4 == 0) goto LAB_001049eb;
            }
LAB_001049bc:
            pcStackY_170 = (code *)0x1049e6;
            iVar4 = size_filter(unaff_R14,(uint)(pcVar9 == (char *)0x0),min,max,length,convert,
                                just_count);
            uVar14 = uVar14 + iVar4;
          }
          else {
            if (iVar4 == 0) {
              pcStackY_170 = (code *)0x1049a2;
              iVar4 = search_header(re,(unaff_R14->comment).s);
              if (iVar4 == 0) goto LAB_001049bc;
            }
LAB_001049eb:
            input_file = (char *)(ulong)((int)input_file + 1);
          }
          pcStackY_170 = (code *)0x1049f5;
          iVar4 = kseq_read(unaff_R14);
        } while (-1 < iVar4);
      }
      pcStackY_170 = (code *)0x104a01;
      pcre2_code_free_8(re);
      pcStackY_170 = (code *)0x104a0a;
      free((unaff_R14->name).s);
      pcStackY_170 = (code *)0x104a13;
      free((unaff_R14->comment).s);
      pcStackY_170 = (code *)0x104a1c;
      free((unaff_R14->seq).s);
      pcStackY_170 = (code *)0x104a25;
      free((unaff_R14->qual).s);
      pkVar7 = unaff_R14->f;
      if (pkVar7 != (kstream_t *)0x0) {
        pcStackY_170 = (code *)0x104a37;
        free(pkVar7->buf);
        pcStackY_170 = (code *)0x104a3f;
        free(pkVar7);
      }
      pcStackY_170 = (code *)0x104a47;
      free(unaff_R14);
      pcStackY_170 = (code *)0x104a51;
      gzclose(local_148);
      if (just_count != 0) {
        pcStackY_170 = (code *)0x104a76;
        fprintf(_stdout,"Total output: %i\n",(ulong)uVar14);
        pcStackY_170 = (code *)0x104a89;
        fprintf(_stdout,"Total excluded: %i\n",input_file);
      }
      return uVar14;
    }
  }
  str_00 = local_138;
  pcStackY_170 = kseq_read;
  pull_by_re_cold_2();
  pkVar7 = (kstream_t *)str_00[4].m;
  pcStackY_190 = input_file;
  uStackY_188 = unaff_R12;
  pkStackY_180 = unaff_R14;
  pcStackY_178 = aStrRegex;
  pcStackY_170 = (code *)(ulong)(uint)exclude;
  if ((int)str_00[4].l == 0) {
    iVar4 = pkVar7->begin;
    iVar5 = pkVar7->end;
    iVar13 = -1;
    do {
      if ((pkVar7->is_eof != 0) && (iVar5 <= iVar4)) {
        return -1;
      }
      puVar8 = pkVar7->buf;
      if (iVar5 <= iVar4) {
        pkVar7->begin = 0;
        iVar5 = gzread(pkVar7->f,puVar8,0xffff);
        pkVar7->end = iVar5;
        if (iVar5 == 0) goto LAB_00104dba;
        iVar4 = pkVar7->begin;
        puVar8 = pkVar7->buf;
      }
      lVar12 = (long)iVar4;
      iVar4 = iVar4 + 1;
      pkVar7->begin = iVar4;
      bVar1 = puVar8[lVar12];
      uStackY_194 = (uint)bVar1;
    } while ((uStackY_194 != 0x40) && (bVar1 != 0x3e));
    *(uint *)&str_00[4].l = (uint)bVar1;
  }
  str_00[3].l = 0;
  str_00[2].l = 0;
  str_00[1].l = 0;
  iVar4 = ks_getuntil2(pkVar7,0,str_00,(int *)&uStackY_194,0);
  if (iVar4 < 0) {
    iVar4 = -1;
  }
  else {
    if (uStackY_194 != 10) {
      ks_getuntil2(pkVar7,2,str_00 + 1,(int *)0x0,0);
    }
    if (str_00[2].s == (char *)0x0) {
      str_00[2].m = 0x100;
      pcVar9 = (char *)malloc(0x100);
      str_00[2].s = pcVar9;
    }
    str = str_00 + 2;
    iVar4 = pkVar7->begin;
    iVar5 = pkVar7->end;
    bVar3 = iVar4 < iVar5;
    if (pkVar7->is_eof == 0 || bVar3) {
      do {
        puVar8 = pkVar7->buf;
        if (!bVar3) {
          pkVar7->begin = 0;
          iVar5 = gzread(pkVar7->f,puVar8,0xffff);
          pkVar7->end = iVar5;
          if (iVar5 == 0) {
            pkVar7->is_eof = 1;
            break;
          }
          iVar4 = pkVar7->begin;
          puVar8 = pkVar7->buf;
        }
        lVar12 = (long)iVar4;
        iVar4 = iVar4 + 1;
        pkVar7->begin = iVar4;
        bVar1 = puVar8[lVar12];
        uStackY_194 = (uint)bVar1;
        uVar14 = (uint)bVar1;
        if (uStackY_194 < 0x2b) {
          if (uVar14 != 10) goto LAB_00104c2e;
        }
        else {
          if (uVar14 == 0x2b) goto LAB_00104c97;
          if ((uVar14 == 0x3e) || (uVar14 == 0x40)) {
            *(uint *)&str_00[4].l = uVar14;
            goto LAB_00104c97;
          }
LAB_00104c2e:
          sVar11 = str_00[2].l;
          str_00[2].l = sVar11 + 1;
          str_00[2].s[sVar11] = bVar1;
          ks_getuntil2(pkVar7,2,str,(int *)0x0,1);
          iVar4 = pkVar7->begin;
          iVar5 = pkVar7->end;
        }
        bVar3 = iVar4 < iVar5;
      } while ((pkVar7->is_eof == 0) || (iVar4 < iVar5));
    }
    uStackY_194 = 0xffffffff;
LAB_00104c97:
    sVar11 = str_00[2].l;
    pcVar9 = str_00[2].s;
    uVar10 = sVar11 + 1;
    if (str_00[2].m <= uVar10) {
      uVar10 = uVar10 >> 1 | uVar10;
      uVar10 = uVar10 >> 2 | uVar10;
      uVar10 = uVar10 >> 4 | uVar10;
      uVar10 = uVar10 >> 8 | uVar10;
      __size = (uVar10 >> 0x10 | uVar10) + 1;
      str_00[2].m = __size;
      pcVar9 = (char *)realloc(pcVar9,__size);
      str_00[2].s = pcVar9;
      sVar11 = str_00[2].l;
    }
    pcVar9[sVar11] = '\0';
    if (uStackY_194 == 0x2b) {
      uVar10 = str_00[2].m;
      if (str_00[3].m < uVar10) {
        str_00[3].m = uVar10;
        pcVar9 = (char *)realloc(str_00[3].s,uVar10);
        str_00[3].s = pcVar9;
      }
      iVar4 = pkVar7->begin;
      iVar5 = pkVar7->end;
      iVar13 = -2;
      do {
        if ((pkVar7->is_eof != 0) && (iVar5 <= iVar4)) {
          return -2;
        }
        puVar8 = pkVar7->buf;
        if (iVar5 <= iVar4) {
          pkVar7->begin = 0;
          iVar5 = gzread(pkVar7->f,puVar8,0xffff);
          pkVar7->end = iVar5;
          if (iVar5 == 0) {
LAB_00104dba:
            pkVar7->is_eof = 1;
            return iVar13;
          }
          iVar4 = pkVar7->begin;
          puVar8 = pkVar7->buf;
        }
        lVar12 = (long)iVar4;
        iVar4 = iVar4 + 1;
        pkVar7->begin = iVar4;
        uStackY_194 = (uint)puVar8[lVar12];
      } while (uStackY_194 != 10);
      uStackY_194 = 10;
      do {
        iVar4 = ks_getuntil2(pkVar7,2,str_00 + 3,(int *)0x0,1);
        uVar10 = str->l;
        uVar2 = str_00[3].l;
        if (iVar4 < 0) break;
      } while (uVar2 < uVar10);
      *(undefined4 *)&str_00[4].l = 0;
      iVar4 = -2;
      if (uVar10 == uVar2) {
        iVar4 = (int)uVar10;
      }
    }
    else {
      iVar4 = (int)str->l;
    }
  }
  return iVar4;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_re(char *input_file, char *aStrRegex, int min, int max, int length, int exclude, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* pcre2 variables */
	pcre2_code *re; // the regex object
	PCRE2_SIZE erroroffset;
	int errornumber;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

        if (verbose_flag) {
            if (is_fasta)
                fprintf(stderr, "Input is FASTA format\n");
            else
                fprintf(stderr, "Input is FASTQ format\n");
        }

	/* initialize the re */
	re = pcre2_compile(
			aStrRegex,             /* the pattern */
			PCRE2_ZERO_TERMINATED, /* indicates pattern is zero-terminated */
			0,                     /* default options */
			&errornumber,          /* for error num */
			&erroroffset,          /* err offset */
			NULL);                 /* default compile context */

	if (re == NULL) {
		  PCRE2_UCHAR buffer[256];
		  pcre2_get_error_message(errornumber, buffer, sizeof(buffer));
		  fprintf(stderr, "PCRE2 compilation failed at offset %d: %s\n", (int)erroroffset, buffer);
		  exit(EXIT_FAILURE);
	}

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		if (exclude) {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s))
				excluded++;
			else {
				/* regex doesn't match, so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			}
		} else {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s)) {
				/* regex matches so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			} else
				excluded++;
		}
	} /* end of seq traversal */

	/* tear down re */
	pcre2_code_free(re); /* free up the re */

	kseq_destroy(seq);
	gzclose(fp); /* done reading file so close */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}